

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-kill.c
# Opt level: O1

uint borg_guess_race_name(char *who)

{
  bool bVar1;
  monster_race *pmVar2;
  char **ppcVar3;
  uint *puVar4;
  int *piVar5;
  _Bool _Var6;
  int iVar7;
  int iVar8;
  size_t sVar9;
  char *pcVar10;
  int iVar11;
  char *pcVar12;
  wchar_t wVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  wchar_t wVar17;
  wchar_t wVar18;
  ulong uVar19;
  char partial [160];
  char local_d8 [168];
  
  sVar9 = strlen(who);
  ppcVar3 = borg_unique_text;
  uVar19 = 0;
  wVar17 = borg_unique_size;
  if (L'\x01' < borg_unique_size) {
    do {
      wVar13 = ((int)uVar19 + wVar17) / 2;
      iVar7 = strcmp(ppcVar3[wVar13],who);
      if (iVar7 < 1) {
        uVar19 = (ulong)(uint)wVar13;
        wVar13 = wVar17;
      }
      wVar17 = wVar13;
    } while ((int)uVar19 < wVar13 + L'\xffffffff');
    uVar19 = (ulong)(int)uVar19;
  }
  iVar7 = strcmp(who,borg_unique_text[uVar19]);
  if (iVar7 == 0) {
    uVar14 = borg_unique_what[uVar19];
  }
  else {
    _Var6 = suffix(who," (offscreen)");
    pcVar12 = who;
    if (_Var6) {
      pcVar12 = local_d8;
      my_strcpy(pcVar12,who,0xa0);
      local_d8[(int)sVar9 + -0xc] = '\0';
      pcVar10 = format("# Handling offscreen monster (%s)",pcVar12);
      borg_note(pcVar10);
    }
    _Var6 = prefix(pcVar12,"The ");
    if ((_Var6) || (_Var6 = prefix(pcVar12,"the "), _Var6)) {
      ppcVar3 = borg_normal_text;
      pcVar12 = pcVar12 + 4;
      uVar14 = 0;
      wVar13 = L'\0';
      wVar17 = borg_normal_size;
      if (L'\x01' < borg_normal_size) {
        do {
          wVar18 = (wVar17 + wVar13) / 2;
          iVar7 = strcmp(ppcVar3[wVar18],pcVar12);
          if (iVar7 < 1) {
            wVar13 = wVar18;
            wVar18 = wVar17;
          }
          wVar17 = wVar18;
        } while (wVar13 < wVar18 + L'\xffffffff');
      }
      piVar5 = borg.trait;
      puVar4 = borg_normal_what;
      ppcVar3 = borg_normal_text;
      pmVar2 = r_info;
      if (L'\xffffffff' < wVar13) {
        iVar7 = 0;
        uVar14 = 0;
        lVar15 = (ulong)(uint)wVar13 + 1;
        do {
          iVar8 = strcmp(pcVar12,ppcVar3[lVar15 + -1]);
          if (iVar8 != 0) break;
          iVar11 = pmVar2[(int)puVar4[lVar15 + -1]].level - piVar5[0x69];
          iVar8 = -iVar11;
          if (0 < iVar11) {
            iVar8 = iVar11;
          }
          if (uVar14 == 0 || iVar7 <= 1000 - iVar8) {
            uVar14 = puVar4[lVar15 + -1];
            iVar7 = 1000 - iVar8;
          }
          lVar16 = lVar15 + -1;
          bVar1 = 0 < lVar15;
          lVar15 = lVar16;
        } while (lVar16 != 0 && bVar1);
      }
      if (uVar14 != 0) {
        return uVar14;
      }
      pcVar10 = "# Assuming player ghost (%s)(b)";
    }
    else {
      pcVar10 = "# Assuming player ghost (%s) (a)";
    }
    pcVar12 = format(pcVar10,pcVar12);
    borg_note(pcVar12);
    uVar14 = z_info->r_max - 1;
  }
  return uVar14;
}

Assistant:

static unsigned int borg_guess_race_name(char *who)
{
    int k, m, n;

    int i, b_i = 0;
    int s, b_s = 0;

    struct monster_race *r_ptr;

    char partial[160];
    int  len = strlen(who);

    /* Start the search */
    m = 0;
    n = borg_unique_size;

    /* Binary search */
    while (m < n - 1) {
        /* Pick a "middle" entry */
        i = (m + n) / 2;

        /* Search to the right (or here) */
        if (strcmp(borg_unique_text[i], who) <= 0) {
            m = i;
        }

        /* Search to the left */
        else {
            n = i;
        }
    }

    /* Check for equality */
    if (streq(who, borg_unique_text[m])) {
        /* Use this monster */
        return (borg_unique_what[m]);
    }

    /* Hack -- handle "offscreen" */
    if (suffix(who, " (offscreen)")) {
        /* Remove the suffix */
        my_strcpy(partial, who, sizeof(partial));
        partial[len - 12] = '\0';
        who               = partial;

        /* Message */
        borg_note(format("# Handling offscreen monster (%s)", who));
    }

    /* Assume player ghost */
    if (!prefix(who, "The ") && !prefix(who, "the ")) {
        /* Message */
        borg_note(format("# Assuming player ghost (%s) (a)", who));

        /* Oops */
        return (z_info->r_max - 1);
    }

    /* Skip the prefix */
    who += 4;

    /* Start the search */
    m = 0;
    n = borg_normal_size;

    /* Binary search */
    while (m < n - 1) {
        /* Pick a "middle" entry */
        i = (m + n) / 2;

        /* Search to the right (or here) */
        if (strcmp(borg_normal_text[i], who) <= 0) {
            m = i;
        }

        /* Search to the left */
        else {
            n = i;
        }
    }

    /* Scan possibilities */
    for (k = m; k >= 0; k--) {
        /* Stop when done */
        if (!streq(who, borg_normal_text[k]))
            break;

        /* Extract the monster */
        i = (int)borg_normal_what[k];

        /* Access the monster */
        r_ptr = &r_info[i];

        /* Basic score */
        s = 1000;

        /* Penalize "depth miss" */
        s = s - ABS(r_ptr->level - borg.trait[BI_CDEPTH]);

        /* Track best */
        if (b_i && (s < b_s))
            continue;

        /* Track it */
        b_i = i;
        b_s = s;
    }

    /* Success */
    if (b_i)
        return ((unsigned int)b_i);

    /* No match found */
    borg_note(format("# Assuming player ghost (%s)(b)", who));

    /* Oops */
    return (z_info->r_max - 1);
}